

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlsxio_read_sharedstrings.c
# Opt level: O0

void shared_strings_callback_find_shared_string_end(void *callbackdata,XML_Char *name)

{
  int iVar1;
  shared_strings_callback_data *data;
  XML_Char *name_local;
  void *callbackdata_local;
  
  iVar1 = strcasecmp(name,"t");
  if (iVar1 == 0) {
    XML_SetElementHandler
              (*callbackdata,shared_strings_callback_find_shared_string_start,
               shared_strings_callback_find_shared_stringitem_end);
    XML_SetCharacterDataHandler(*callbackdata,0);
  }
  else {
    shared_strings_callback_find_shared_stringitem_end(callbackdata,name);
  }
  return;
}

Assistant:

void shared_strings_callback_find_shared_string_end (void* callbackdata, const XML_Char* name)
{
  struct shared_strings_callback_data* data = (struct shared_strings_callback_data*)callbackdata;
  if (XML_Char_icmp(name, X("t")) == 0) {
    XML_SetElementHandler(data->xmlparser, shared_strings_callback_find_shared_string_start, shared_strings_callback_find_shared_stringitem_end);
    XML_SetCharacterDataHandler(data->xmlparser, NULL);
  } else {
    shared_strings_callback_find_shared_stringitem_end(callbackdata, name);
  }
}